

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

bool FIX::BoolConvertor::convert(string *value)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  FieldConvertError *this;
  
  if (value->_M_string_length == 1) {
    cVar1 = *(value->_M_dataplus)._M_p;
    if (cVar1 == 'Y') {
      bVar3 = true;
      bVar2 = true;
      goto LAB_00277454;
    }
    if (cVar1 == 'N') {
      bVar2 = true;
      bVar3 = false;
      goto LAB_00277454;
    }
  }
  bVar3 = false;
  bVar2 = false;
LAB_00277454:
  if (bVar2) {
    return bVar3;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

static bool convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    bool result = false;
    if( !convert( value, result ) )
      throw FieldConvertError(value);
    else
      return result;
  }